

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void mqc_erterm_enc(opj_mqc_t *mqc)

{
  int iVar1;
  
  for (iVar1 = 0xc - mqc->ct; 0 < iVar1; iVar1 = iVar1 - mqc->ct) {
    mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
    mqc->ct = 0;
    mqc_byteout(mqc);
  }
  if (*mqc->bp != 0xff) {
    mqc_byteout(mqc);
    return;
  }
  return;
}

Assistant:

void mqc_erterm_enc(opj_mqc_t *mqc) {
	int k = 11 - mqc->ct + 1;
	
	while (k > 0) {
		mqc->c <<= mqc->ct;
		mqc->ct = 0;
		mqc_byteout(mqc);
		k -= mqc->ct;
	}
	
	if (*mqc->bp != 0xff) {
		mqc_byteout(mqc);
	}
}